

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O2

cmCommand * __thiscall cmState::GetCommand(cmState *this,string *name)

{
  cmCommand *pcVar1;
  string local_30;
  
  cmsys::SystemTools::LowerCase(&local_30,name);
  pcVar1 = GetCommandByExactName(this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return pcVar1;
}

Assistant:

cmCommand* cmState::GetCommand(std::string const& name) const
{
  return GetCommandByExactName(cmSystemTools::LowerCase(name));
}